

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
duckdb::Connection::
CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<int>,int,int>
          (Connection *this,string *name,LogicalType *ret_type,LogicalType *input_type_a)

{
  type pCVar1;
  LogicalType *in_R8;
  AggregateFunction function;
  LogicalType aLStack_288 [24];
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  UDFWrapper::
  CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<int>,int,int>
            (&local_140,(UDFWrapper *)name,(string *)ret_type,input_type_a,in_R8);
  AggregateFunction::AggregateFunction(&local_270,&local_140);
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(aLStack_288,INVALID);
  duckdb::UDFWrapper::RegisterAggrFunction(&local_270,pCVar1,aLStack_288);
  duckdb::LogicalType::~LogicalType(aLStack_288);
  AggregateFunction::~AggregateFunction(&local_270);
  AggregateFunction::~AggregateFunction(&local_140);
  return;
}

Assistant:

void CreateAggregateFunction(const string &name, LogicalType ret_type, LogicalType input_type_a) {
		AggregateFunction function =
		    UDFWrapper::CreateAggregateFunction<UDF_OP, STATE, TR, TA>(name, ret_type, input_type_a);
		UDFWrapper::RegisterAggrFunction(function, *context);
	}